

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rough_plastic.hpp
# Opt level: O3

void __thiscall RoughPlasticBSDF::RoughPlasticBSDF(RoughPlasticBSDF *this,Json *conf)

{
  float fVar1;
  const_reference pvVar2;
  long lVar3;
  undefined **ppuVar4;
  int iVar5;
  undefined8 uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  MT19937Sampler sampler;
  undefined **local_13b0 [625];
  undefined8 local_28;
  
  BSDF::BSDF(&this->super_BSDF,conf);
  (this->super_BSDF)._vptr_BSDF = (_func_int **)&PTR_f_0016ab38;
  (this->Ks).x = 1.0;
  (this->Ks).y = 1.0;
  (this->Ks).z = 1.0;
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)conf,"ior");
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_float,_0>
            (pvVar2,(float *)local_13b0);
  *(float *)&(this->super_BSDF).field_0x24 = local_13b0[0]._0_4_;
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)conf,"roughness");
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_float,_0>
            (pvVar2,(float *)local_13b0);
  this->alpha = local_13b0[0]._0_4_;
  local_13b0[0] = &PTR_get1f_00169f00;
  local_13b0[1] = (undefined **)0x0;
  lVar3 = 2;
  ppuVar4 = (undefined **)0x0;
  do {
    ppuVar4 = (undefined **)
              (ulong)((((uint)((ulong)ppuVar4 >> 0x1e) ^ (uint)ppuVar4) * 0x6c078965 + (int)lVar3) -
                     1);
    local_13b0[lVar3] = ppuVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x271);
  local_28 = 0x270;
  iVar5 = 1000000;
  fVar1 = 0.0;
  do {
    uVar6 = (*(code *)local_13b0[0][5])(local_13b0);
    fVar9 = (float)((ulong)uVar6 >> 0x20);
    fVar9 = (1.0 - (float)uVar6 * (float)uVar6) - fVar9 * fVar9;
    if (fVar9 <= 0.0) {
      fVar9 = 0.0;
    }
    fVar9 = SQRT(fVar9);
    fVar10 = 1.0 / *(float *)&(this->super_BSDF).field_0x24;
    fVar7 = 1.0 - fVar9 * fVar9;
    if (fVar7 <= 0.0) {
      fVar7 = 0.0;
    }
    fVar8 = SQRT(fVar7) / fVar10;
    fVar7 = 1.0;
    if (fVar8 < 1.0) {
      fVar7 = 1.0 - fVar8 * fVar8;
      if (fVar7 < 0.0) {
        fVar7 = sqrtf(fVar7);
      }
      else {
        fVar7 = SQRT(fVar7);
      }
      fVar8 = (fVar10 * fVar9 - fVar7) / (fVar10 * fVar9 + fVar7);
      fVar9 = (fVar9 - fVar10 * fVar7) / (fVar10 * fVar7 + fVar9);
      fVar7 = (fVar9 * fVar9 + fVar8 * fVar8) * 0.5;
    }
    fVar1 = fVar1 + (1.0 - fVar7);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  this->outRatio = fVar1 / 1e+06;
  return;
}

Assistant:

RoughPlasticBSDF(const Json& conf): BSDF(conf)
	{
		IOR = conf["ior"];
		alpha = conf["roughness"];
		// precompute outRatio
		// here bruteforcing to demonstrate its physical meaning
		// you can optimize by using approximating polynormial
		MT19937Sampler sampler;
		const int nsample = 1000000;
		double energy = 0; // use double here because accumulating process introduces lots of rounding error
		for (int i=0; i<nsample; ++i) {
			vec3f lambert_out = sampler.cosSampleHemisphereSurface();
			energy += 1 - DielectricBRDF::reflectivity(lambert_out.z, 1/IOR);
		}
		outRatio = energy / nsample;
	}